

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLRISEFALL3METHODS_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_000004b8;
  double *in_stack_000004c0;
  double *in_stack_000004c8;
  double *in_stack_000004d0;
  int in_stack_000004dc;
  int in_stack_000004e0;
  int *in_stack_000004f0;
  int *in_stack_000004f8;
  int *in_stack_00000500;
  
  TVar1 = TA_CDLRISEFALL3METHODS
                    (in_stack_000004e0,in_stack_000004dc,in_stack_000004d0,in_stack_000004c8,
                     in_stack_000004c0,in_stack_000004b8,in_stack_000004f0,in_stack_000004f8,
                     in_stack_00000500);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLRISEFALL3METHODS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLRISEFALL3METHODS(
/* Generated */                             startIdx,
/* Generated */                             endIdx,
/* Generated */                             params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                             params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                             params->in[0].data.inPrice.low, /* inLow */
/* Generated */                             params->in[0].data.inPrice.close, /* inClose */
/* Generated */                             outBegIdx, 
/* Generated */                             outNBElement, 
/* Generated */                             params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }